

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineBuffer.cpp
# Opt level: O0

void __thiscall yb::LineBuffer::LineBuffer(LineBuffer *this,size_t size)

{
  char *pcVar1;
  size_t size_local;
  LineBuffer *this_local;
  
  std::__cxx11::string::string((string *)this);
  __gnu_cxx::
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::__normal_iterator(&this->position_);
  std::__cxx11::string::reserve((ulong)this);
  pcVar1 = (char *)std::__cxx11::string::begin();
  (this->position_)._M_current = pcVar1;
  return;
}

Assistant:

LineBuffer::LineBuffer(size_t size) {
    buffer_.reserve(size);
    position_ = buffer_.begin();
}